

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

void __thiscall QPDF::copyStreamData(QPDF *this,QPDFObjectHandle *result,QPDFObjectHandle *foreign)

{
  bool bVar1;
  pointer pMVar2;
  CopiedStreamDataProvider *pCVar3;
  unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *puVar4;
  logic_error *this_00;
  element_type *peVar5;
  element_type *peVar6;
  pointer pMVar7;
  allocator<char> local_319;
  string local_318 [32];
  QPDFObjectHandle local_2f8;
  allocator<char> local_2e1;
  string local_2e0 [32];
  QPDFObjectHandle local_2c0;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_2b0;
  shared_ptr<QPDF::ForeignStreamData> local_2a0;
  undefined1 local_289;
  QPDFObjectHandle local_288;
  undefined1 local_278 [8];
  shared_ptr<QPDF::ForeignStreamData> foreign_stream_data;
  string local_260 [32];
  QPDFObjectHandle local_240;
  allocator<char> local_229;
  string local_228 [32];
  QPDFObjectHandle local_208;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_1f8;
  QPDFObjectHandle local_1e8;
  allocator<char> local_1d1;
  string local_1d0 [32];
  QPDFObjectHandle local_1b0;
  allocator<char> local_199;
  string local_198 [32];
  QPDFObjectHandle local_178;
  shared_ptr<Buffer> local_168;
  undefined1 local_158 [8];
  shared_ptr<QPDFObjectHandle::StreamDataProvider> stream_provider;
  allocator<char> local_131;
  string local_130 [32];
  QPDFObjectHandle local_110;
  allocator<char> local_f9;
  string local_f8 [32];
  QPDFObjectHandle local_d8;
  QPDFObjectHandle local_c8;
  undefined1 local_b8 [8];
  shared_ptr<Buffer> stream_buffer;
  Stream stream;
  string local_90;
  unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *local_70;
  QPDF *foreign_stream_qpdf;
  QPDFObjGen local_og;
  undefined1 local_40 [8];
  QPDFObjectHandle old_dict;
  QPDFObjectHandle dict;
  QPDFObjectHandle *foreign_local;
  QPDFObjectHandle *result_local;
  QPDF *this_local;
  
  QPDFObjectHandle::getDict
            ((QPDFObjectHandle *)
             &old_dict.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::getDict((QPDFObjectHandle *)local_40);
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  if (pMVar2->copied_stream_data_provider == (CopiedStreamDataProvider *)0x0) {
    pCVar3 = (CopiedStreamDataProvider *)operator_new(0x78);
    CopiedStreamDataProvider::CopiedStreamDataProvider(pCVar3,this);
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    pMVar2->copied_stream_data_provider = pCVar3;
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::
    shared_ptr<QPDF::CopiedStreamDataProvider,void>
              ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&local_og,
               pMVar2->copied_stream_data_provider);
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::operator=
              (&pMVar2->copied_streams,(shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&local_og
              );
    std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr
              ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&local_og);
  }
  foreign_stream_qpdf = (QPDF *)QPDFObjectHandle::getObjGen(result);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"unable to retrieve owning qpdf from foreign stream",
             (allocator<char> *)
             ((long)&stream.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  puVar4 = &QPDFObjectHandle::getQPDF(foreign,&local_90)->m;
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&stream.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  local_70 = puVar4;
  QPDFObjectHandle::as_stream
            ((QPDFObjectHandle *)
             &stream_buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (typed)foreign);
  bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool
                    ((BaseHandle *)
                     &stream_buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  if (bVar1) {
    ::qpdf::Stream::getStreamDataBuffer((Stream *)local_b8);
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (local_70);
    if (((pMVar2->immediate_copy_from & 1U) != 0) &&
       (bVar1 = std::operator==((shared_ptr<Buffer> *)local_b8,(nullptr_t)0x0), bVar1)) {
      QTC::TC("qpdf","QPDF immediate copy stream data",0);
      QPDFObjectHandle::getRawStreamData(&local_c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_f8,"/Filter",&local_f9);
      QPDFObjectHandle::getKey(&local_d8,(string *)local_40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_130,"/DecodeParms",&local_131);
      QPDFObjectHandle::getKey(&local_110,(string *)local_40);
      QPDFObjectHandle::replaceStreamData
                (foreign,(shared_ptr<Buffer> *)&local_c8,&local_d8,&local_110);
      QPDFObjectHandle::~QPDFObjectHandle(&local_110);
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator(&local_131);
      QPDFObjectHandle::~QPDFObjectHandle(&local_d8);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator(&local_f9);
      std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)&local_c8);
      ::qpdf::Stream::getStreamDataBuffer
                ((Stream *)
                 &stream_provider.
                  super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::shared_ptr<Buffer>::operator=
                ((shared_ptr<Buffer> *)local_b8,
                 (shared_ptr<Buffer> *)
                 &stream_provider.
                  super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::shared_ptr<Buffer>::~shared_ptr
                ((shared_ptr<Buffer> *)
                 &stream_provider.
                  super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    ::qpdf::Stream::getStreamDataProvider((Stream *)local_158);
    peVar5 = std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)local_b8);
    if (peVar5 == (element_type *)0x0) {
      peVar6 = std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>::
               get((__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2> *
                   )local_158);
      if (peVar6 == (element_type *)0x0) {
        pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (local_70);
        pMVar7 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (local_70);
        local_288.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             QPDFObjectHandle::getParsedOffset(foreign);
        local_288.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)
                 ::qpdf::Stream::getLength
                           ((Stream *)
                            &stream_buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
        local_289 = ::qpdf::Stream::isRootMetadata
                              ((Stream *)
                               &stream_buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
        std::
        make_shared<QPDF::ForeignStreamData,std::shared_ptr<QPDF::EncryptionParameters>&,std::shared_ptr<InputSource>&,QPDFObjectHandle&,long_long,unsigned_long,QPDFObjectHandle&,bool>
                  ((shared_ptr<QPDF::EncryptionParameters> *)local_278,
                   (shared_ptr<InputSource> *)&pMVar2->encp,(QPDFObjectHandle *)&pMVar7->file,
                   (longlong *)foreign,
                   (unsigned_long *)
                   &local_288.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   &local_288,
                   (bool *)&old_dict.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        pCVar3 = pMVar2->copied_stream_data_provider;
        std::shared_ptr<QPDF::ForeignStreamData>::shared_ptr
                  (&local_2a0,(shared_ptr<QPDF::ForeignStreamData> *)local_278);
        CopiedStreamDataProvider::registerForeignStream
                  (pCVar3,(QPDFObjGen *)&foreign_stream_qpdf,&local_2a0);
        std::shared_ptr<QPDF::ForeignStreamData>::~shared_ptr(&local_2a0);
        pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr
                  (&local_2b0,&pMVar2->copied_streams);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_2e0,"/Filter",&local_2e1);
        QPDFObjectHandle::getKey
                  (&local_2c0,
                   (string *)
                   &old_dict.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_318,"/DecodeParms",&local_319);
        QPDFObjectHandle::getKey
                  (&local_2f8,
                   (string *)
                   &old_dict.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        QPDFObjectHandle::replaceStreamData(result,&local_2b0,&local_2c0,&local_2f8);
        QPDFObjectHandle::~QPDFObjectHandle(&local_2f8);
        std::__cxx11::string::~string(local_318);
        std::allocator<char>::~allocator(&local_319);
        QPDFObjectHandle::~QPDFObjectHandle(&local_2c0);
        std::__cxx11::string::~string(local_2e0);
        std::allocator<char>::~allocator(&local_2e1);
        std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr(&local_2b0);
        std::shared_ptr<QPDF::ForeignStreamData>::~shared_ptr
                  ((shared_ptr<QPDF::ForeignStreamData> *)local_278);
      }
      else {
        QTC::TC("qpdf","QPDF copy foreign stream with provider",0);
        pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        pCVar3 = pMVar2->copied_stream_data_provider;
        QPDFObjectHandle::QPDFObjectHandle(&local_1e8,foreign);
        CopiedStreamDataProvider::registerForeignStream
                  (pCVar3,(QPDFObjGen *)&foreign_stream_qpdf,&local_1e8);
        QPDFObjectHandle::~QPDFObjectHandle(&local_1e8);
        pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr
                  (&local_1f8,&pMVar2->copied_streams);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_228,"/Filter",&local_229);
        QPDFObjectHandle::getKey
                  (&local_208,
                   (string *)
                   &old_dict.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_260,"/DecodeParms",
                   (allocator<char> *)
                   ((long)&foreign_stream_data.
                           super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        QPDFObjectHandle::getKey
                  (&local_240,
                   (string *)
                   &old_dict.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        QPDFObjectHandle::replaceStreamData(result,&local_1f8,&local_208,&local_240);
        QPDFObjectHandle::~QPDFObjectHandle(&local_240);
        std::__cxx11::string::~string(local_260);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&foreign_stream_data.
                           super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        QPDFObjectHandle::~QPDFObjectHandle(&local_208);
        std::__cxx11::string::~string(local_228);
        std::allocator<char>::~allocator(&local_229);
        std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr(&local_1f8);
      }
    }
    else {
      QTC::TC("qpdf","QPDF copy foreign stream with buffer",0);
      std::shared_ptr<Buffer>::shared_ptr(&local_168,(shared_ptr<Buffer> *)local_b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_198,"/Filter",&local_199);
      QPDFObjectHandle::getKey
                (&local_178,
                 (string *)
                 &old_dict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1d0,"/DecodeParms",&local_1d1);
      QPDFObjectHandle::getKey
                (&local_1b0,
                 (string *)
                 &old_dict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFObjectHandle::replaceStreamData(result,&local_168,&local_178,&local_1b0);
      QPDFObjectHandle::~QPDFObjectHandle(&local_1b0);
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator(&local_1d1);
      QPDFObjectHandle::~QPDFObjectHandle(&local_178);
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator(&local_199);
      std::shared_ptr<Buffer>::~shared_ptr(&local_168);
    }
    std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr
              ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)local_158);
    std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_b8);
    ::qpdf::Stream::~Stream
              ((Stream *)
               &stream_buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_40);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &old_dict.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,"unable to retrieve underlying stream object from foreign stream");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
QPDF::copyStreamData(QPDFObjectHandle result, QPDFObjectHandle foreign)
{
    // This method was originally written for copying foreign streams, but it is used by
    // QPDFObjectHandle to copy streams from the same QPDF object as well.

    QPDFObjectHandle dict = result.getDict();
    QPDFObjectHandle old_dict = foreign.getDict();
    if (m->copied_stream_data_provider == nullptr) {
        m->copied_stream_data_provider = new CopiedStreamDataProvider(*this);
        m->copied_streams =
            std::shared_ptr<QPDFObjectHandle::StreamDataProvider>(m->copied_stream_data_provider);
    }
    QPDFObjGen local_og(result.getObjGen());
    // Copy information from the foreign stream so we can pipe its data later without keeping the
    // original QPDF object around.

    QPDF& foreign_stream_qpdf =
        foreign.getQPDF("unable to retrieve owning qpdf from foreign stream");

    auto stream = foreign.as_stream();
    if (!stream) {
        throw std::logic_error("unable to retrieve underlying stream object from foreign stream");
    }
    std::shared_ptr<Buffer> stream_buffer = stream.getStreamDataBuffer();
    if ((foreign_stream_qpdf.m->immediate_copy_from) && (stream_buffer == nullptr)) {
        // Pull the stream data into a buffer before attempting the copy operation. Do it on the
        // source stream so that if the source stream is copied multiple times, we don't have to
        // keep duplicating the memory.
        QTC::TC("qpdf", "QPDF immediate copy stream data");
        foreign.replaceStreamData(
            foreign.getRawStreamData(),
            old_dict.getKey("/Filter"),
            old_dict.getKey("/DecodeParms"));
        stream_buffer = stream.getStreamDataBuffer();
    }
    std::shared_ptr<QPDFObjectHandle::StreamDataProvider> stream_provider =
        stream.getStreamDataProvider();
    if (stream_buffer.get()) {
        QTC::TC("qpdf", "QPDF copy foreign stream with buffer");
        result.replaceStreamData(
            stream_buffer, dict.getKey("/Filter"), dict.getKey("/DecodeParms"));
    } else if (stream_provider.get()) {
        // In this case, the remote stream's QPDF must stay in scope.
        QTC::TC("qpdf", "QPDF copy foreign stream with provider");
        m->copied_stream_data_provider->registerForeignStream(local_og, foreign);
        result.replaceStreamData(
            m->copied_streams, dict.getKey("/Filter"), dict.getKey("/DecodeParms"));
    } else {
        auto foreign_stream_data = std::make_shared<ForeignStreamData>(
            foreign_stream_qpdf.m->encp,
            foreign_stream_qpdf.m->file,
            foreign,
            foreign.getParsedOffset(),
            stream.getLength(),
            dict,
            stream.isRootMetadata());
        m->copied_stream_data_provider->registerForeignStream(local_og, foreign_stream_data);
        result.replaceStreamData(
            m->copied_streams, dict.getKey("/Filter"), dict.getKey("/DecodeParms"));
    }
}